

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall
wasm::TranslateToFuzzReader::recombine(wasm::Function*)::Scanner::visitExpression(wasm::Expression__
          (void *this,Expression *curr)

{
  iterator __position;
  bool bVar1;
  vector<wasm::Expression*,std::allocator<wasm::Expression*>> *this_00;
  Type type_00;
  pointer pTVar2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_58;
  Type local_40;
  Type type;
  Expression *curr_local;
  
  type.id = (uintptr_t)curr;
  bVar1 = canBeArbitrarilyReplaced(*(TranslateToFuzzReader **)((long)this + 0xd8),curr);
  if (bVar1) {
    getRelevantTypes(wasm::Type_(&local_58,*(void **)(type.id + 8),type_00);
    if (local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pTVar2 = local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        local_40.id = pTVar2->id;
        this_00 = (vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                  InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                  ::operator[]((InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                *)((long)this + 0xe0),&local_40);
        __position._M_current = *(Expression ***)(this_00 + 8);
        if (__position._M_current == *(Expression ***)(this_00 + 0x10)) {
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          _M_realloc_insert<wasm::Expression*const&>(this_00,__position,(Expression **)&type);
        }
        else {
          *__position._M_current = (Expression *)type.id;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
        pTVar2 = pTVar2 + 1;
      } while (pTVar2 != local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      if (parent.canBeArbitrarilyReplaced(curr)) {
        for (auto type : getRelevantTypes(curr->type)) {
          exprsByType[type].push_back(curr);
        }
      }
    }